

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O1

bool __thiscall
llvm::StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::erase
          (StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *this,StringRef Key)

{
  StringMapEntryBase *V;
  int iVar1;
  ulong uVar2;
  bool bVar3;
  
  iVar1 = StringMapImpl::FindKey(&this->super_StringMapImpl,Key);
  uVar2 = (ulong)iVar1;
  bVar3 = uVar2 != (this->super_StringMapImpl).NumBuckets;
  if (bVar3 && iVar1 != -1) {
    V = (this->super_StringMapImpl).TheTable[uVar2];
    StringMapImpl::RemoveKey(&this->super_StringMapImpl,V);
    free(V);
  }
  return bVar3 && iVar1 != -1;
}

Assistant:

bool erase(StringRef Key) {
    iterator I = find(Key);
    if (I == end()) return false;
    erase(I);
    return true;
  }